

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbuildmultiphysicsmesh.cpp
# Opt level: O0

void TPZBuildMultiphysicsMesh::TransferFromMeshesT<double>
               (TPZVec<TPZCompMesh_*> *cmeshVec,TPZCompMesh *MFMesh)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int64_t iVar5;
  TPZFMatrix<double> *pTVar6;
  pair<TPZCompMesh_*,_long> *ppVar7;
  TPZFMatrix<double> *pTVar8;
  TPZConnect *pTVar9;
  int64_t iVar10;
  double *pdVar11;
  TPZCompMesh *pTVar12;
  long lVar13;
  TPZCompMesh *in_RSI;
  TPZSubCompMesh *sub;
  TPZCompEl *cel;
  int64_t el;
  int64_t nel;
  double valsub;
  int posfather;
  int idf_1;
  int64_t seqnumsub;
  TPZConnect *consub;
  TPZFMatrix<double> *solsub;
  TPZBlock *blocksub;
  size_t in_stack_00000188;
  int nblock;
  int64_t seqnumfather;
  TPZConnect *confather;
  TPZFMatrix<double> *solfather;
  TPZBlock *blockfather;
  int64_t submeshIndex;
  int64_t fatherconIndex;
  int ic;
  int nconnect_1;
  TPZCompEl *compel;
  TPZFMatrix<double> *fathermeshSol;
  TPZCompMesh *fathermesh;
  TPZSubCompMesh *msub;
  double getval;
  int idf;
  int64_t seqnumMF;
  TPZConnect *conMF;
  int blsize;
  int64_t seqnum;
  TPZConnect *con;
  TPZFMatrix<double> *sol;
  TPZBlock *block;
  TPZCompMesh *atomic_mesh;
  int64_t connect;
  TPZFMatrix<double> *solMF;
  TPZBlock *blockMF;
  int64_t nconnect;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> indexes;
  long in_stack_fffffffffffffd68;
  TPZCompMesh *in_stack_fffffffffffffd70;
  int64_t in_stack_fffffffffffffd78;
  TPZSubCompMesh *in_stack_fffffffffffffd80;
  _func_int **in_stack_fffffffffffffd88;
  TPZBlock *in_stack_fffffffffffffd90;
  TPZCompMesh *in_stack_fffffffffffffd98;
  TPZFMatrix<double> *in_stack_fffffffffffffda0;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  TPZCompMesh *local_200;
  TPZCompMesh *local_1e8;
  long local_150;
  int local_134;
  int local_d8;
  int local_a4;
  int64_t local_60;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> local_30;
  TPZCompMesh *local_10;
  
  local_10 = in_RSI;
  TPZVec<std::pair<TPZCompMesh_*,_long>_>::TPZVec(&local_30);
  ComputeAtomicIndexes
            ((TPZCompMesh *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
             in_stack_fffffffffffffda8);
  iVar5 = TPZVec<std::pair<TPZCompMesh_*,_long>_>::size(&local_30);
  TPZCompMesh::Block(local_10);
  TPZCompMesh::Solution(local_10);
  pTVar6 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                     ((TPZSolutionMatrix *)in_stack_fffffffffffffd70);
  for (local_60 = 0; local_60 < iVar5; local_60 = local_60 + 1) {
    ppVar7 = TPZVec<std::pair<TPZCompMesh_*,_long>_>::operator[](&local_30,local_60);
    pTVar12 = ppVar7->first;
    if (pTVar12 != (TPZCompMesh *)0x0) {
      TPZCompMesh::Block(pTVar12);
      TPZCompMesh::Solution(pTVar12);
      pTVar8 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                         ((TPZSolutionMatrix *)in_stack_fffffffffffffd70);
      TPZCompMesh::ConnectVec(pTVar12);
      TPZVec<std::pair<TPZCompMesh_*,_long>_>::operator[](&local_30,local_60);
      pTVar9 = TPZChunkVector<TPZConnect,_10>::operator[]
                         ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffd90,
                          (int64_t)in_stack_fffffffffffffd88);
      iVar10 = TPZConnect::SequenceNumber(pTVar9);
      if (iVar10 < 0) {
        pzinternal::DebugStopImpl((char *)seqnumfather,in_stack_00000188);
      }
      iVar2 = TPZBlock::Size((TPZBlock *)in_stack_fffffffffffffd70,
                             (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
      TPZCompMesh::ConnectVec(local_10);
      pTVar9 = TPZChunkVector<TPZConnect,_10>::operator[]
                         ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffd90,
                          (int64_t)in_stack_fffffffffffffd88);
      iVar10 = TPZConnect::SequenceNumber(pTVar9);
      if (iVar10 < 0) {
        pzinternal::DebugStopImpl((char *)seqnumfather,in_stack_00000188);
      }
      for (local_a4 = 0; local_a4 < iVar2; local_a4 = local_a4 + 1) {
        iVar10 = TPZBlock::Index(in_stack_fffffffffffffd90,(int64_t)in_stack_fffffffffffffd88,
                                 (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        pdVar11 = TPZFMatrix<double>::operator()(pTVar8,iVar10);
        dVar1 = *pdVar11;
        iVar10 = TPZBlock::Index(in_stack_fffffffffffffd90,(int64_t)in_stack_fffffffffffffd88,
                                 (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        pdVar11 = TPZFMatrix<double>::operator()(pTVar6,iVar10);
        *pdVar11 = dVar1;
      }
    }
  }
  if (local_10 == (TPZCompMesh *)0x0) {
    local_1e8 = (TPZCompMesh *)0x0;
  }
  else {
    local_1e8 = (TPZCompMesh *)
                __dynamic_cast(local_10,&TPZCompMesh::typeinfo,&TPZSubCompMesh::typeinfo,0);
  }
  if (local_1e8 != (TPZCompMesh *)0x0) {
    pTVar12 = (TPZCompMesh *)(**(code **)(*(long *)local_1e8 + 0x98))();
    TPZCompMesh::Solution(pTVar12);
    pTVar6 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                       ((TPZSolutionMatrix *)in_stack_fffffffffffffd70);
    local_200 = (TPZCompMesh *)0x0;
    if (local_1e8 != (TPZCompMesh *)0x0) {
      local_200 = local_1e8 + 1;
    }
    iVar2 = (**(code **)(*(long *)local_200 + 0x90))();
    for (local_d8 = 0; local_d8 < iVar2; local_d8 = local_d8 + 1) {
      lVar13 = (**(code **)(*(long *)local_200 + 0xa0))(local_200,local_d8);
      TPZSubCompMesh::InternalIndex(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if (lVar13 == -1) {
        pzinternal::DebugStopImpl((char *)seqnumfather,in_stack_00000188);
      }
      TPZCompMesh::Block(pTVar12);
      TPZCompMesh::Solution(pTVar12);
      TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                ((TPZSolutionMatrix *)in_stack_fffffffffffffd70);
      TPZCompMesh::ConnectVec(pTVar12);
      pTVar9 = TPZChunkVector<TPZConnect,_10>::operator[]
                         ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffd90,
                          (int64_t)in_stack_fffffffffffffd88);
      iVar5 = TPZConnect::SequenceNumber(pTVar9);
      iVar3 = TPZBlock::Size((TPZBlock *)in_stack_fffffffffffffd70,
                             (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
      TPZCompMesh::Block(local_1e8);
      TPZCompMesh::Solution(local_1e8);
      pTVar8 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                         ((TPZSolutionMatrix *)in_stack_fffffffffffffd70);
      TPZCompMesh::ConnectVec(local_1e8);
      pTVar9 = TPZChunkVector<TPZConnect,_10>::operator[]
                         ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffd90,
                          (int64_t)in_stack_fffffffffffffd88);
      TPZConnect::SequenceNumber(pTVar9);
      if (iVar5 < 0) {
        pzinternal::DebugStopImpl((char *)seqnumfather,in_stack_00000188);
      }
      for (local_134 = 0; local_134 < iVar3; local_134 = local_134 + 1) {
        iVar4 = TPZBlock::Position((TPZBlock *)in_stack_fffffffffffffd70,
                                   (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
        in_stack_fffffffffffffda0 = pTVar8;
        iVar5 = TPZBlock::Index(in_stack_fffffffffffffd90,(int64_t)in_stack_fffffffffffffd88,
                                (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        in_stack_fffffffffffffd98 =
             (TPZCompMesh *)TPZFMatrix<double>::operator()(in_stack_fffffffffffffda0,iVar5);
        in_stack_fffffffffffffd88 = *(_func_int ***)in_stack_fffffffffffffd98;
        in_stack_fffffffffffffd90 =
             (TPZBlock *)TPZFMatrix<double>::operator()(pTVar6,(long)(iVar4 + local_134));
        (in_stack_fffffffffffffd90->super_TPZSavable)._vptr_TPZSavable = in_stack_fffffffffffffd88;
      }
    }
  }
  iVar5 = TPZCompMesh::NElements((TPZCompMesh *)0x1e42cc1);
  for (local_150 = 0; local_150 < iVar5; local_150 = local_150 + 1) {
    in_stack_fffffffffffffd70 =
         (TPZCompMesh *)TPZCompMesh::Element(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    if (in_stack_fffffffffffffd70 == (TPZCompMesh *)0x0) {
      in_stack_fffffffffffffd68 = 0;
    }
    else {
      in_stack_fffffffffffffd68 =
           __dynamic_cast(in_stack_fffffffffffffd70,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,
                          0x918);
    }
    if (in_stack_fffffffffffffd68 != 0) {
      TransferFromMeshes((TPZVec<TPZCompMesh_*> *)in_stack_fffffffffffffda0,
                         in_stack_fffffffffffffd98);
    }
  }
  TPZVec<std::pair<TPZCompMesh_*,_long>_>::~TPZVec
            ((TPZVec<std::pair<TPZCompMesh_*,_long>_> *)in_stack_fffffffffffffd70);
  return;
}

Assistant:

void TPZBuildMultiphysicsMesh::TransferFromMeshesT(TPZVec<TPZCompMesh *> &cmeshVec,
                                                   TPZCompMesh *MFMesh)
{
    
    TPZVec<atomic_index> indexes;
    ComputeAtomicIndexes(MFMesh, indexes);
    int64_t nconnect = indexes.size();
    TPZBlock &blockMF = MFMesh->Block();
    TPZFMatrix<TVar> &solMF = MFMesh->Solution();
    for(int64_t connect = 0; connect < nconnect; connect++)
    {
        TPZCompMesh *atomic_mesh = indexes[connect].first;
        if(!atomic_mesh) continue;
		TPZBlock &block = atomic_mesh->Block();
        TPZFMatrix<TVar> &sol = atomic_mesh->Solution();
        TPZConnect &con = atomic_mesh->ConnectVec()[indexes[connect].second];
        int64_t seqnum = con.SequenceNumber();
        if(seqnum<0) DebugStop();       /// Whether connect was deleted by previous refined process
        int blsize = block.Size(seqnum);
        TPZConnect &conMF = MFMesh->ConnectVec()[connect];
        int64_t seqnumMF = conMF.SequenceNumber();
        if(seqnumMF < 0) DebugStop();
        for (int idf=0; idf<blsize; idf++) {
            auto getval = sol(block.Index(seqnum, idf));
            solMF(blockMF.Index(seqnumMF, idf)) = getval;
        }
	}
    
    
    // copy the solution of the submesh to father mesh
    if(1)
    {
        TPZSubCompMesh *msub = dynamic_cast<TPZSubCompMesh*>(MFMesh);
        if(msub){
            TPZCompMesh * fathermesh = msub->FatherMesh();
            //TODOCOMPLEX
            TPZFMatrix<TVar> &fathermeshSol = fathermesh->Solution();
            TPZCompEl *compel = dynamic_cast<TPZCompEl*>(msub);
            int nconnect = compel->NConnects();
            
            for(int ic=0; ic<nconnect ; ic++){
                
                int64_t fatherconIndex = compel->ConnectIndex(ic);
                int64_t submeshIndex = msub->InternalIndex(fatherconIndex);
                if(fatherconIndex == -1) DebugStop();
                //acessing the block on father mesh
                TPZBlock &blockfather = fathermesh->Block();
                TPZFMatrix<TVar> &solfather = fathermesh->Solution();
                
                TPZConnect &confather = fathermesh->ConnectVec()[fatherconIndex];
                int64_t seqnumfather = confather.SequenceNumber();
                int nblock = blockfather.Size(seqnumfather);
                //acessing the block on submesh
                TPZBlock &blocksub = msub->Block();
                TPZFMatrix<TVar> &solsub = ((TPZCompMesh *)(msub))->Solution();
                const TPZConnect &consub = msub->ConnectVec()[submeshIndex];
                const int64_t seqnumsub = consub.SequenceNumber();
                
                if(seqnumfather < 0) DebugStop();
                for(int idf=0 ; idf<nblock; idf++){
                    const int posfather = blockfather.Position(seqnumfather);
                    auto valsub = solsub(blocksub.Index(seqnumsub, idf));
                    fathermeshSol(posfather + idf) = valsub;
                }
            }
            
        }
    }
    
    int64_t nel = MFMesh->NElements();
    for (int64_t el = 0; el<nel; el++) {
        TPZCompEl *cel = MFMesh->Element(el);
        TPZSubCompMesh *sub = dynamic_cast<TPZSubCompMesh *>(cel);
        if(sub)
        {
            TransferFromMeshes(cmeshVec, sub);
        }
    }
}